

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

void __thiscall
testing::internal::
TypedExpectation<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>::
~TypedExpectation(TypedExpectation<const_ot::commissioner::EnergyReport_*(const_ot::commissioner::Address_&)>
                  *this)

{
  _Function_base *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_00347e30;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (_Function_base *)*ppvVar1;
    if (this_00 != (_Function_base *)0x0) {
      std::_Function_base::~_Function_base(this_00);
    }
    operator_delete(this_00);
  }
  std::_Function_base::~_Function_base((_Function_base *)&this->repeated_action_);
  MatcherBase<const_std::tuple<const_ot::commissioner::Address_&>_&>::~MatcherBase
            (&(this->extra_matcher_).
              super_MatcherBase<const_std::tuple<const_ot::commissioner::Address_&>_&>);
  MatcherBase<const_ot::commissioner::Address_&>::~MatcherBase
            ((MatcherBase<const_ot::commissioner::Address_&> *)&this->matchers_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

~TypedExpectation() override {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }